

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

int RSA_public_decrypt(int flen,uchar *from,uchar *to,RSA *rsa,int padding)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_0000003c;
  ulong local_40;
  size_t out_len;
  RSA *pRStack_30;
  int padding_local;
  RSA *rsa_local;
  uint8_t *to_local;
  uint8_t *from_local;
  size_t flen_local;
  
  from_local = (uint8_t *)CONCAT44(in_register_0000003c,flen);
  out_len._4_4_ = padding;
  pRStack_30 = rsa;
  rsa_local = (RSA *)to;
  to_local = from;
  uVar1 = RSA_size(rsa);
  iVar2 = RSA_verify_raw((RSA *)rsa,&local_40,to,(ulong)uVar1,to_local,(size_t)from_local,
                         out_len._4_4_);
  if (iVar2 == 0) {
    flen_local._4_4_ = -1;
  }
  else if (local_40 < 0x80000000) {
    flen_local._4_4_ = (int)local_40;
  }
  else {
    ERR_put_error(4,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                  ,0x207);
    flen_local._4_4_ = -1;
  }
  return flen_local._4_4_;
}

Assistant:

int RSA_public_decrypt(size_t flen, const uint8_t *from, uint8_t *to, RSA *rsa,
                       int padding) {
  size_t out_len;
  if (!RSA_verify_raw(rsa, &out_len, to, RSA_size(rsa), from, flen, padding)) {
    return -1;
  }

  if (out_len > INT_MAX) {
    OPENSSL_PUT_ERROR(RSA, ERR_R_OVERFLOW);
    return -1;
  }
  return (int)out_len;
}